

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,CallOrCast *call)

{
  pool_ref<soul::AST::Expression> *e_00;
  Allocator *pAVar1;
  pointer pPVar2;
  Scope *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  CommaSeparatedList *pCVar6;
  TypeCast *pTVar7;
  QualifiedIdentifier *pQVar8;
  pool_ref<soul::AST::ASTObject> *ppVar9;
  Expression *pEVar10;
  ProcessorBase *pPVar11;
  bool bVar12;
  bool bVar13;
  pool_ptr<soul::AST::QualifiedIdentifier> name;
  pool_ptr<soul::AST::Expression> e;
  pool_ref<soul::AST::ASTObject> local_180;
  pool_ptr<soul::AST::Expression> local_178;
  pool_ref<soul::AST::ASTObject> local_170;
  pool_ptr<soul::AST::ProcessorBase> p;
  RefCountedPtr<soul::Structure> local_158 [9];
  pool_ref<soul::AST::Expression> local_110;
  Type local_108;
  NameSearch search;
  
  pTVar7 = (TypeCast *)&(call->super_CallOrCastBase).arguments;
  if ((call->super_CallOrCastBase).arguments.object != (CommaSeparatedList *)0x0) {
    pCVar6 = pool_ptr<soul::AST::CommaSeparatedList>::operator*
                       ((pool_ptr<soul::AST::CommaSeparatedList> *)pTVar7);
    RewritingASTVisitor::visitObject((RewritingASTVisitor *)this,&pCVar6->super_Expression);
  }
  bVar3 = AST::CallOrCastBase::areAllArgumentsResolved(&call->super_CallOrCastBase);
  if (!bVar3) {
    return (Expression *)call;
  }
  e_00 = &call->nameOrType;
  local_110.object = (call->nameOrType).object;
  if ((local_110.object)->kind == type) {
    iVar5 = (*((local_110.object)->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((char)iVar5 != '\0') {
      pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator
      ;
      (*(((call->nameOrType).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])
                (&local_108);
      pTVar7 = convertToCast(pAVar1,call,&local_108);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_108.structure);
      return &pTVar7->super_Expression;
    }
    local_110.object = e_00->object;
  }
  cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>((soul *)&name,&local_110);
  if (name.object == (QualifiedIdentifier *)0x0) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e_00);
    return (Expression *)call;
  }
  pQVar8 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
  pPVar2 = (pQVar8->pathSections).
           super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(pQVar8->pathSections).
             super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 != 0x60) ||
     ((pPVar2->specialisationArgs).object != (Expression *)0x0)) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e_00);
    return (Expression *)call;
  }
  pQVar8 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&search,pQVar8);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&search);
  if (1 < search.itemsFound.numActive) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e_00);
  }
  bVar3 = this->parsingProcessorInstance != 0;
  bVar12 = (this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0;
  search.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)search.itemsFound.space;
  search.itemsFound.numActive = 0;
  search.itemsFound.numAllocated = 8;
  search.partiallyQualifiedPath.pathSections.items =
       (Identifier *)search.partiallyQualifiedPath.pathSections.space;
  search.partiallyQualifiedPath.pathSections.numActive = 0;
  search.partiallyQualifiedPath.pathSections.numAllocated = 8;
  search.stopAtFirstScopeWithResults = false;
  search.requiredNumFunctionArgs = -1;
  search.findVariables = true;
  search.findTypes = true;
  search.findFunctions = true;
  search.findNamespaces = true;
  search.findProcessors = true;
  search.findProcessorInstances = false;
  search.findEndpoints = true;
  search.onlyFindLocalVariables = false;
  pQVar8 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&p,pQVar8);
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&search.partiallyQualifiedPath.pathSections,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)&p);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&p);
  search.stopAtFirstScopeWithResults = true;
  search.findVariables = false;
  search.findTypes = true;
  search.findFunctions = false;
  search.findNamespaces = bVar3 || bVar12;
  search.findProcessorInstances = false;
  search.findEndpoints = false;
  search.findProcessors = bVar3 || bVar12;
  pQVar8 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&name);
  this_00 = (pQVar8->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  if (this_00 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_00,&search,(this->currentStatement).object);
  }
  if (search.itemsFound.numActive != 1) {
    bVar4 = true;
    goto LAB_0023debb;
  }
  ppVar9 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                     (&search.itemsFound);
  local_170.object = ppVar9->object;
  cast<soul::AST::Expression,soul::AST::ASTObject>((soul *)&e,&local_170);
  if (e.object == (Expression *)0x0) {
    bVar13 = false;
LAB_0023de04:
    bVar4 = (bool)(bVar13 ^ 1);
    if ((!bVar13) && (bVar3 || bVar12)) {
      ppVar9 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                         (&search.itemsFound);
      local_180.object = ppVar9->object;
      cast<soul::AST::ProcessorBase,soul::AST::ASTObject>((soul *)&p,&local_180);
      bVar4 = p.object == (ProcessorBase *)0x0;
      if (!bVar4) {
        pPVar11 = pool_ptr<soul::AST::ProcessorBase>::operator*(&p);
        pTVar7 = (TypeCast *)resolveProcessorInstance(this,call,pPVar11);
      }
    }
  }
  else {
    local_178.object = e.object;
    bVar4 = AST::isResolvedAsType(&local_178);
    if (bVar4) {
      pAVar1 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator
      ;
      pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&e);
      (*(pEVar10->super_Statement).super_ASTObject._vptr_ASTObject[5])(&p,pEVar10);
      pCVar6 = pool_ptr<soul::AST::CommaSeparatedList>::operator*
                         ((pool_ptr<soul::AST::CommaSeparatedList> *)pTVar7);
      pTVar7 = PoolAllocator::
               allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::AST::CommaSeparatedList&>
                         (&pAVar1->pool,
                          &(call->super_CallOrCastBase).super_Expression.super_Statement.
                           super_ASTObject.context,(Type *)&p,pCVar6);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(local_158);
    }
    else if (bVar3 || bVar12) {
      pEVar10 = pool_ptr<soul::AST::Expression>::operator->(&e);
      (*(pEVar10->super_Statement).super_ASTObject._vptr_ASTObject[6])(&p,pEVar10);
      bVar13 = p.object != (ProcessorBase *)0x0;
      if (bVar13) {
        pPVar11 = pool_ptr<soul::AST::ProcessorBase>::operator*(&p);
        pTVar7 = (TypeCast *)resolveProcessorInstance(this,call,pPVar11);
      }
      goto LAB_0023de04;
    }
    bVar4 = !bVar4;
  }
LAB_0023debb:
  AST::Scope::NameSearch::~NameSearch(&search);
  if (!bVar4) {
    return &pTVar7->super_Expression;
  }
  return (Expression *)call;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            if (call.arguments != nullptr)
                visitObject (*call.arguments);

            if (call.areAllArgumentsResolved())
            {
                if (AST::isResolvedAsType (call.nameOrType.get()))
                    return convertToCast (allocator, call, call.nameOrType->resolveAsType());

                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (! name->isSimplePath())
                    {
                        replaceExpression (call.nameOrType);
                        return call;
                    }

                    if (name->getPath().isQualified())
                        replaceExpression (call.nameOrType);

                    bool canResolveProcessorInstance = (parsingProcessorInstance != 0 || currentConnectionEndpoint != nullptr);

                    AST::Scope::NameSearch search;
                    search.partiallyQualifiedPath = name->getPath();
                    search.stopAtFirstScopeWithResults = true;
                    search.findVariables = false;
                    search.findTypes = true;
                    search.findFunctions = false;
                    search.findNamespaces = canResolveProcessorInstance;
                    search.findProcessors = canResolveProcessorInstance;
                    search.findProcessorInstances = false;
                    search.findEndpoints = false;

                    if (auto scope = name->getParentScope())
                        scope->performFullNameSearch (search, currentStatement.get());

                    if (search.itemsFound.size() == 1)
                    {
                        if (auto e = cast<AST::Expression> (search.itemsFound.front()))
                        {
                            if (AST::isResolvedAsType (e))
                                return allocator.allocate<AST::TypeCast> (call.context, e->resolveAsType(), *call.arguments);

                            if (canResolveProcessorInstance)
                                if (auto p = e->getAsProcessor())
                                    return resolveProcessorInstance (call, *p);
                        }

                        if (canResolveProcessorInstance)
                            if (auto p = cast<AST::ProcessorBase> (search.itemsFound.front()))
                                return resolveProcessorInstance (call, *p);
                    }
                }
                else
                {
                    replaceExpression (call.nameOrType);
                }
            }

            return call;
        }